

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

QStringList *
QFontDatabase::families(QStringList *__return_storage_ptr__,WritingSystem writingSystem)

{
  QtFontFamily *this;
  QtFontFoundry *pQVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  Type *mutex;
  long lVar5;
  int j;
  long lVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  mutex = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
          operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                      *)__return_storage_ptr__);
  QMutexLocker<QRecursiveMutex>::QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_48,mutex);
  QFontDatabasePrivate::ensureFontDatabase();
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar5 = 0;
  do {
    if (QFontDatabasePrivate::instance::instance.count <= lVar5) {
      QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    this = QFontDatabasePrivate::instance::instance.families[lVar5];
    bVar3 = *(byte *)this;
    if (((bVar3 & 1) == 0) || (this->count != 0)) {
      if (writingSystem != Any) {
        bVar2 = QtFontFamily::ensurePopulated(this);
        if ((!bVar2) || (this->writingSystems[writingSystem] != '\x01')) goto LAB_00428180;
        bVar3 = *(byte *)this;
      }
      if (((bVar3 & 1) == 0) || (iVar4 = this->count, iVar4 == 1)) {
        QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,&this->name);
      }
      else {
        for (lVar6 = 0; lVar6 < iVar4; lVar6 = lVar6 + 1) {
          local_68.d = (this->name).d.d;
          local_68.ptr = (this->name).d.ptr;
          local_68.size = (this->name).d.size;
          if (local_68.d != (Data *)0x0) {
            LOCK();
            ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pQVar1 = this->foundries[lVar6];
          local_88.d = (pQVar1->name).d.d;
          local_88.ptr = (pQVar1->name).d.ptr;
          local_88.size = (pQVar1->name).d.size;
          if (local_88.d != (Data *)0x0) {
            LOCK();
            ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          if (local_88.size != 0) {
            QString::append((QLatin1String *)&local_68);
            QString::append((QString *)&local_68);
            QString::append((QChar)(char16_t)&local_68);
          }
          QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,(QString *)&local_68);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
          iVar4 = this->count;
        }
      }
    }
LAB_00428180:
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

QStringList QFontDatabase::families(WritingSystem writingSystem)
{
    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QStringList flist;
    for (int i = 0; i < d->count; i++) {
        QtFontFamily *f = d->families[i];
        if (f->populated && f->count == 0)
            continue;
        if (writingSystem != Any) {
            if (!f->ensurePopulated())
                continue;
            if (f->writingSystems[writingSystem] != QtFontFamily::Supported)
                continue;
        }
        if (!f->populated || f->count == 1) {
            flist.append(f->name);
        } else {
            for (int j = 0; j < f->count; j++) {
                QString str = f->name;
                QString foundry = f->foundries[j]->name;
                if (!foundry.isEmpty()) {
                    str += " ["_L1;
                    str += foundry;
                    str += u']';
                }
                flist.append(str);
            }
        }
    }
    return flist;
}